

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Exe.cpp
# Opt level: O0

int amrex::parser_local_symbol_index
              (parser_symbol *sym,Vector<char_*,_std::allocator<char_*>_> *local_variables)

{
  bool bVar1;
  difference_type dVar2;
  anon_class_8_1_ba1d7a27_for__M_pred in_RSI;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_RDI;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>_>
  r;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_stack_ffffffffffffffa8;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
  in_stack_ffffffffffffffb8;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_stack_ffffffffffffffd0;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_stack_ffffffffffffffd8;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
  in_stack_ffffffffffffffe0;
  int local_4;
  
  std::vector<char_*,_std::allocator<char_*>_>::rbegin
            ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffffb8._M_current);
  std::vector<char_*,_std::allocator<char_*>_>::rend
            ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffffb8._M_current);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char**,std::vector<char*,std::allocator<char*>>>>,amrex::parser_local_symbol_index(amrex::parser_symbol*,amrex::Vector<char*,std::allocator<char*>>&)::__0>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>_>
              *)in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8,in_RSI);
  std::vector<char_*,_std::allocator<char_*>_>::rend
            ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffffb8._M_current);
  bVar1 = std::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (bVar1) {
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>_>
    ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>_>
                        *)&stack0xffffffffffffffb8,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>_>
                        *)&stack0xffffffffffffffe0);
    std::vector<char_*,_std::allocator<char_*>_>::rend
              ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffffb8._M_current);
    dVar2 = std::
            distance<std::reverse_iterator<__gnu_cxx::__normal_iterator<char**,std::vector<char*,std::allocator<char*>>>>>
                      (in_stack_ffffffffffffffd0,in_RDI);
    local_4 = (int)dVar2 + -1;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int parser_local_symbol_index (struct parser_symbol* sym, Vector<char*>& local_variables)
{
    auto r = std::find_if(local_variables.rbegin(), local_variables.rend(),
                          [=] (char* i) { return std::strcmp(sym->name, i) == 0; });
    if (r != local_variables.rend()) {
        return std::distance(r, local_variables.rend()) - 1;
    } else {
        return -1;
    }
}